

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,string *str)

{
  char *pcVar1;
  int iVar2;
  
  str->_M_string_length = 0;
  *(str->_M_dataplus)._M_p = '\0';
  pcVar1 = this->buffer_end_;
  if ((long)size <= (long)(pcVar1 + ((long)this->limit_ - (long)ptr))) {
    std::__cxx11::string::reserve((ulong)str);
    pcVar1 = this->buffer_end_;
  }
  iVar2 = ((int)pcVar1 - (int)ptr) + 0x10;
  do {
    if (this->next_chunk_ == (char *)0x0) {
      return (char *)0x0;
    }
    std::__cxx11::string::append((char *)str,(ulong)ptr);
    if (this->limit_ < 0x11) {
      return (char *)0x0;
    }
    pcVar1 = Next(this);
    if (pcVar1 == (char *)0x0) {
      return (char *)0x0;
    }
    size = size - iVar2;
    ptr = pcVar1 + 0x10;
    iVar2 = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
  } while (iVar2 < size);
  std::__cxx11::string::append((char *)str,(ulong)ptr);
  return ptr + size;
}

Assistant:

const char* EpsCopyInputStream::ReadStringFallback(const char* ptr, int size,
                                                   std::string* str) {
  str->clear();
  if (PROTOBUF_PREDICT_TRUE(size <= buffer_end_ - ptr + limit_)) {
    // Reserve the string up to a static safe size. If strings are bigger than
    // this we proceed by growing the string as needed. This protects against
    // malicious payloads making protobuf hold on to a lot of memory.
    str->reserve(str->size() + std::min<int>(size, kSafeStringSize));
  }
  return AppendSize(ptr, size,
                    [str](const char* p, int s) { str->append(p, s); });
}